

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezone.cpp
# Opt level: O1

void __thiscall QTimeZone::Data::~Data(Data *this)

{
  int *piVar1;
  
  if ((((byte)*this & 3) == 0) && (*(long *)this != 0)) {
    LOCK();
    piVar1 = (int *)(*(long *)this + 8);
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if ((*piVar1 == 0) && (*(long **)this != (long *)0x0)) {
      (**(code **)(**(long **)this + 8))();
    }
  }
  *(undefined8 *)this = 0;
  return;
}

Assistant:

QTimeZone::Data::~Data()
{
#if QT_CONFIG(timezone)
    if (!isShort() && d && !d->ref.deref())
        delete d;
    d = nullptr;
#endif
}